

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O1

string * __thiscall
VulkanHppGenerator::generateSizeCheck
          (string *__return_storage_ptr__,VulkanHppGenerator *this,
          vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
          *arrayIts,string *structName,bool mutualExclusiveLens)

{
  pointer p_Var1;
  MemberData *pMVar2;
  pointer pcVar3;
  _Bit_type *p_Var4;
  size_type sVar5;
  bool bVar6;
  int iVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  pointer p_Var9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  ulong uVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  size_type __n;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  ulong uVar14;
  long lVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  string strippedValue_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string assertionCheck;
  string strippedValue;
  string sum;
  string throwText;
  string assertionText;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  vector<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
  *local_198;
  allocator_type local_189;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_188;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  ulong local_c8;
  string *local_c0;
  ulong local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (8 < (ulong)((long)(arrayIts->
                        super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(arrayIts->
                       super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start)) {
    local_198 = arrayIts;
    local_c0 = structName;
    if ((generateSizeCheck(std::vector<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>,std::allocator<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>>>const&,std::__cxx11::string_const&,bool)
         ::throwTextTemplate_abi_cxx11_ == '\0') &&
       (iVar7 = __cxa_guard_acquire(&generateSizeCheck(std::vector<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>,std::allocator<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>>>const&,std::__cxx11::string_const&,bool)
                                     ::throwTextTemplate_abi_cxx11_), iVar7 != 0)) {
      generateSizeCheck(std::vector<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>,std::allocator<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>>>const&,std::__cxx11::string_const&,bool)
      ::throwTextTemplate_abi_cxx11_._M_dataplus._M_p =
           (pointer)&generateSizeCheck(std::vector<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>,std::allocator<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>>>const&,std::__cxx11::string_const&,bool)
                     ::throwTextTemplate_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &generateSizeCheck(std::vector<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>,std::allocator<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>>>const&,std::__cxx11::string_const&,bool)
                  ::throwTextTemplate_abi_cxx11_,
                 "      if ( ${throwCheck} )\n      {\n        throw LogicError( VULKAN_HPP_NAMESPACE_STRING\"::${structName}::${structName}: ${throwCheck}\" );\n      }\n"
                 ,"");
      __cxa_atexit(std::__cxx11::string::~string,
                   &generateSizeCheck(std::vector<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>,std::allocator<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>>>const&,std::__cxx11::string_const&,bool)
                    ::throwTextTemplate_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&generateSizeCheck(std::vector<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>,std::allocator<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>>>const&,std::__cxx11::string_const&,bool)
                           ::throwTextTemplate_abi_cxx11_);
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    local_b0._M_string_length = 0;
    local_b0.field_2._M_local_buf[0] = '\0';
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    local_e8._M_string_length = 0;
    local_e8.field_2._M_local_buf[0] = '\0';
    if (mutualExclusiveLens) {
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      local_1b8._M_string_length = 0;
      local_1b8.field_2._M_allocated_capacity =
           local_1b8.field_2._M_allocated_capacity & 0xffffffffffffff00;
      p_Var9 = (local_198->
               super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      p_Var1 = (local_198->
               super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (p_Var9 != p_Var1) {
        paVar16 = &local_188.first.field_2;
        do {
          pMVar2 = p_Var9->_M_current;
          local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"p","");
          local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
          pcVar3 = (pMVar2->name)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1d8,pcVar3,pcVar3 + (pMVar2->name)._M_string_length);
          sVar5 = local_218._M_string_length;
          if ((local_218._M_string_length <= local_1d8._M_string_length) &&
             ((local_218._M_string_length == 0 ||
              (iVar7 = bcmp(local_1d8._M_dataplus._M_p,local_218._M_dataplus._M_p,
                            local_218._M_string_length), iVar7 == 0)))) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                      (&local_1d8,0,sVar5);
          }
          anon_unknown.dwarf_1900a8::startLowerCase(&local_1f8,&local_1d8);
          pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   replace(&local_1f8,0,0,"!",1);
          local_238._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
          paVar10 = &pbVar8->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p == paVar10) {
            local_238.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
            local_238.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
            local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
          }
          else {
            local_238.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
          }
          local_238._M_string_length = pbVar8->_M_string_length;
          (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
          pbVar8->_M_string_length = 0;
          (pbVar8->field_2)._M_local_buf[0] = '\0';
          pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_238,"_.empty() + ");
          local_188.first._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
          paVar10 = &pbVar8->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188.first._M_dataplus._M_p == paVar10) {
            local_188.first.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
            local_188.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
            local_188.first._M_dataplus._M_p = (pointer)paVar16;
          }
          else {
            local_188.first.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
          }
          local_188.first._M_string_length = pbVar8->_M_string_length;
          (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
          pbVar8->_M_string_length = 0;
          (pbVar8->field_2)._M_local_buf[0] = '\0';
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&local_1b8,local_188.first._M_dataplus._M_p,local_188.first._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188.first._M_dataplus._M_p != paVar16) {
            operator_delete(local_188.first._M_dataplus._M_p,
                            local_188.first.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != &local_218.field_2) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
          }
          p_Var9 = p_Var9 + 1;
        } while (p_Var9 != p_Var1);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                (&local_1b8,local_1b8._M_string_length - 3,'\0');
      std::operator+(&local_238,"      VULKAN_HPP_ASSERT( ( ",&local_1b8);
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_238," ) <= 1);\n");
      paVar16 = &local_188.first.field_2;
      local_188.first._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar10 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188.first._M_dataplus._M_p == paVar10) {
        local_188.first.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_188.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_188.first._M_dataplus._M_p = (pointer)paVar16;
      }
      else {
        local_188.first.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      }
      local_188.first._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_b0,local_188.first._M_dataplus._M_p,local_188.first._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188.first._M_dataplus._M_p != paVar16) {
        operator_delete(local_188.first._M_dataplus._M_p,
                        local_188.first.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[11],_true>(&local_188,(char (*) [11])"structName",local_c0);
      std::operator+(&local_1d8,"1 < ( ",&local_1b8);
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_1d8," )");
      local_1f8._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar16 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p == paVar16) {
        local_1f8.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
        local_1f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      }
      else {
        local_1f8.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
      }
      local_1f8._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar16;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_148,(char (*) [11])"throwCheck",&local_1f8);
      __l_00._M_len = 2;
      __l_00._M_array = &local_188;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&local_90,__l_00,
            (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_218,(allocator_type *)&local_108);
      replaceWithMap(&local_238,
                     &generateSizeCheck(std::vector<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>,std::allocator<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>>>const&,std::__cxx11::string_const&,bool)
                      ::throwTextTemplate_abi_cxx11_,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_90);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_e8,local_238._M_dataplus._M_p,local_238._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_90);
      lVar15 = -0x80;
      paVar16 = &local_148.second.field_2;
      do {
        if (paVar16 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(&paVar16->_M_allocated_capacity)[-2]) {
          operator_delete((long *)(&paVar16->_M_allocated_capacity)[-2],
                          paVar16->_M_allocated_capacity + 1);
        }
        if (&paVar16->_M_allocated_capacity + -4 !=
            (size_type *)(&paVar16->_M_allocated_capacity)[-6]) {
          operator_delete((size_type *)(&paVar16->_M_allocated_capacity)[-6],
                          (&paVar16->_M_allocated_capacity)[-4] + 1);
        }
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar16->_M_allocated_capacity + -8);
        lVar15 = lVar15 + 0x40;
      } while (lVar15 != 0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      p_Var9 = (local_198->
               super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (8 < (ulong)((long)(local_198->
                            super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)p_Var9)) {
        paVar10 = &local_188.first.field_2;
        paVar16 = &local_218.field_2;
        uVar11 = 1;
        uVar14 = 0;
        do {
          local_188.first._M_string_length =
               (size_type)((p_Var9[uVar14]._M_current)->name)._M_dataplus._M_p;
          local_188.first._M_dataplus._M_p =
               (pointer)((p_Var9[uVar14]._M_current)->name)._M_string_length;
          local_c8 = uVar11;
          bVar6 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with
                            ((basic_string_view<char,_std::char_traits<char>_> *)&local_188,"p");
          if (!bVar6) {
            __assert_fail("arrayIts[first]->name.starts_with( \"p\" )",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                          ,0x2abf,
                          "std::string VulkanHppGenerator::generateSizeCheck(const std::vector<std::vector<MemberData>::const_iterator> &, const std::string &, bool) const"
                         );
          }
          pMVar2 = (local_198->
                   super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start[uVar14]._M_current;
          local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
          local_b8 = uVar14;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"p","");
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
          pcVar3 = (pMVar2->name)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_238,pcVar3,pcVar3 + (pMVar2->name)._M_string_length);
          sVar5 = local_1f8._M_string_length;
          __n = local_238._M_string_length;
          if (local_1f8._M_string_length <= local_238._M_string_length) {
            __n = local_1f8._M_string_length;
          }
          if ((local_1f8._M_string_length <= local_238._M_string_length) &&
             ((__n == 0 ||
              (iVar7 = bcmp(local_238._M_dataplus._M_p,local_1f8._M_dataplus._M_p,__n), iVar7 == 0))
             )) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                      (&local_238,0,sVar5);
          }
          anon_unknown.dwarf_1900a8::startLowerCase(&local_188.first,&local_238);
          pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_188.first,"_");
          local_1b8._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
          paVar13 = &pbVar8->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p == paVar13) {
            local_1b8.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
            local_1b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
            local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
          }
          else {
            local_1b8.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
          }
          local_1b8._M_string_length = pbVar8->_M_string_length;
          (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
          pbVar8->_M_string_length = 0;
          (pbVar8->field_2)._M_local_buf[0] = '\0';
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188.first._M_dataplus._M_p != paVar10) {
            operator_delete(local_188.first._M_dataplus._M_p,
                            local_188.first.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
          p_Var9 = (local_198->
                   super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          uVar11 = local_c8;
          if (local_c8 <
              (ulong)((long)(local_198->
                            super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)p_Var9 >> 3)) {
            do {
              local_188.first._M_string_length =
                   (size_type)((p_Var9[uVar11]._M_current)->name)._M_dataplus._M_p;
              local_188.first._M_dataplus._M_p =
                   (pointer)((p_Var9[uVar11]._M_current)->name)._M_string_length;
              bVar6 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with
                                ((basic_string_view<char,_std::char_traits<char>_> *)&local_188,"p")
              ;
              if (!bVar6) {
                __assert_fail("arrayIts[second]->name.starts_with( \"p\" )",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                              ,0x2ac3,
                              "std::string VulkanHppGenerator::generateSizeCheck(const std::vector<std::vector<MemberData>::const_iterator> &, const std::string &, bool) const"
                             );
              }
              pMVar2 = (local_198->
                       super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start[uVar11]._M_current;
              local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"p","");
              local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
              pcVar3 = (pMVar2->name)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1f8,pcVar3,pcVar3 + (pMVar2->name)._M_string_length);
              sVar5 = local_1d8._M_string_length;
              if ((local_1d8._M_string_length <= local_1f8._M_string_length) &&
                 ((local_1d8._M_string_length == 0 ||
                  (iVar7 = bcmp(local_1f8._M_dataplus._M_p,local_1d8._M_dataplus._M_p,
                                local_1d8._M_string_length), iVar7 == 0)))) {
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                erase(&local_1f8,0,sVar5);
              }
              anon_unknown.dwarf_1900a8::startLowerCase(&local_188.first,&local_1f8);
              pbVar8 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                 (&local_188.first,"_");
              local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
              paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(pbVar8->_M_dataplus)._M_p;
              paVar12 = &pbVar8->field_2;
              if (paVar13 == paVar12) {
                local_238.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                local_238.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
              }
              else {
                local_238.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                local_238._M_dataplus._M_p = (pointer)paVar13;
              }
              local_238._M_string_length = pbVar8->_M_string_length;
              (pbVar8->_M_dataplus)._M_p = (pointer)paVar12;
              pbVar8->_M_string_length = 0;
              (pbVar8->field_2)._M_local_buf[0] = '\0';
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188.first._M_dataplus._M_p != paVar10) {
                operator_delete(local_188.first._M_dataplus._M_p,
                                local_188.first.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                operator_delete(local_1f8._M_dataplus._M_p,
                                local_1f8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                operator_delete(local_1d8._M_dataplus._M_p,
                                local_1d8.field_2._M_allocated_capacity + 1);
              }
              local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1d8,local_1b8._M_dataplus._M_p,
                         local_1b8._M_dataplus._M_p + local_1b8._M_string_length);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&local_1d8,".size() == ");
              pbVar8 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                 (&local_1d8,local_238._M_dataplus._M_p,local_238._M_string_length);
              local_188.first._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
              paVar13 = &pbVar8->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188.first._M_dataplus._M_p == paVar13) {
                local_188.first.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                local_188.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
                local_188.first._M_dataplus._M_p = (pointer)paVar10;
              }
              else {
                local_188.first.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
              }
              local_188.first._M_string_length = pbVar8->_M_string_length;
              (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
              pbVar8->_M_string_length = 0;
              (pbVar8->field_2)._M_local_buf[0] = '\0';
              pbVar8 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                 (&local_188.first,".size()");
              local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
              paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(pbVar8->_M_dataplus)._M_p;
              paVar12 = &pbVar8->field_2;
              if (paVar13 == paVar12) {
                local_1f8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                local_1f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
              }
              else {
                local_1f8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                local_1f8._M_dataplus._M_p = (pointer)paVar13;
              }
              local_1f8._M_string_length = pbVar8->_M_string_length;
              (pbVar8->_M_dataplus)._M_p = (pointer)paVar12;
              pbVar8->_M_string_length = 0;
              (pbVar8->field_2)._M_local_buf[0] = '\0';
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188.first._M_dataplus._M_p != paVar10) {
                operator_delete(local_188.first._M_dataplus._M_p,
                                local_188.first.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                operator_delete(local_1d8._M_dataplus._M_p,
                                local_1d8.field_2._M_allocated_capacity + 1);
              }
              local_218._M_dataplus._M_p = (pointer)paVar16;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_218,local_1b8._M_dataplus._M_p,
                         local_1b8._M_dataplus._M_p + local_1b8._M_string_length);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&local_218,".size() != ");
              pbVar8 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                 (&local_218,local_238._M_dataplus._M_p,local_238._M_string_length);
              local_188.first._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
              paVar13 = &pbVar8->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188.first._M_dataplus._M_p == paVar13) {
                local_188.first.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                local_188.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
                local_188.first._M_dataplus._M_p = (pointer)paVar10;
              }
              else {
                local_188.first.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
              }
              local_188.first._M_string_length = pbVar8->_M_string_length;
              (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
              pbVar8->_M_string_length = 0;
              (pbVar8->field_2)._M_local_buf[0] = '\0';
              pbVar8 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                 (&local_188.first,".size()");
              local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
              paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(pbVar8->_M_dataplus)._M_p;
              paVar12 = &pbVar8->field_2;
              if (paVar13 == paVar12) {
                local_1d8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                local_1d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
              }
              else {
                local_1d8.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
                local_1d8._M_dataplus._M_p = (pointer)paVar13;
              }
              local_1d8._M_string_length = pbVar8->_M_string_length;
              (pbVar8->_M_dataplus)._M_p = (pointer)paVar12;
              pbVar8->_M_string_length = 0;
              (pbVar8->field_2)._M_local_buf[0] = '\0';
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188.first._M_dataplus._M_p != paVar10) {
                operator_delete(local_188.first._M_dataplus._M_p,
                                local_188.first.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218._M_dataplus._M_p != paVar16) {
                operator_delete(local_218._M_dataplus._M_p,
                                local_218.field_2._M_allocated_capacity + 1);
              }
              p_Var9 = (local_198->
                       super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pMVar2 = p_Var9[local_b8]._M_current;
              p_Var4 = *(_Bit_type **)
                        &(pMVar2->optional).super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data;
              if (((p_Var4 == (((_Bit_iterator *)
                               ((long)&(pMVar2->optional).super__Bvector_base<std::allocator<bool>_>
                                       ._M_impl + 0x10))->super__Bit_iterator_base)._M_p) &&
                  (*(uint *)((long)&(pMVar2->optional).super__Bvector_base<std::allocator<bool>_>.
                                    _M_impl + 0x18) == 0)) || ((*p_Var4 & 1) == 0)) {
                pMVar2 = p_Var9[uVar11]._M_current;
                p_Var4 = *(_Bit_type **)
                          &(pMVar2->optional).super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data;
                if (((p_Var4 != (((_Bit_iterator *)
                                 ((long)&(pMVar2->optional).
                                         super__Bvector_base<std::allocator<bool>_>._M_impl + 0x10))
                                ->super__Bit_iterator_base)._M_p) ||
                    (*(uint *)((long)&(pMVar2->optional).super__Bvector_base<std::allocator<bool>_>.
                                      _M_impl + 0x18) != 0)) && ((*p_Var4 & 1) != 0))
                goto LAB_0019b45a;
              }
              else {
LAB_0019b45a:
                std::operator+(&local_218,"( ",&local_1f8);
                pbVar8 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                   (&local_218," )");
                local_188.first._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
                paVar13 = &pbVar8->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_188.first._M_dataplus._M_p == paVar13) {
                  local_188.first.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                  local_188.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
                  local_188.first._M_dataplus._M_p = (pointer)paVar10;
                }
                else {
                  local_188.first.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                }
                local_188.first._M_string_length = pbVar8->_M_string_length;
                (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
                pbVar8->_M_string_length = 0;
                (pbVar8->field_2)._M_local_buf[0] = '\0';
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=(&local_1f8,&local_188.first);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_188.first._M_dataplus._M_p != paVar10) {
                  operator_delete(local_188.first._M_dataplus._M_p,
                                  local_188.first.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218._M_dataplus._M_p != paVar16) {
                  operator_delete(local_218._M_dataplus._M_p,
                                  local_218.field_2._M_allocated_capacity + 1);
                }
                std::operator+(&local_218,"( ",&local_1d8);
                pbVar8 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                   (&local_218," )");
                local_188.first._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
                paVar13 = &pbVar8->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_188.first._M_dataplus._M_p == paVar13) {
                  local_188.first.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                  local_188.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
                  local_188.first._M_dataplus._M_p = (pointer)paVar10;
                }
                else {
                  local_188.first.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                }
                local_188.first._M_string_length = pbVar8->_M_string_length;
                (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
                pbVar8->_M_string_length = 0;
                (pbVar8->field_2)._M_local_buf[0] = '\0';
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                operator=(&local_1d8,&local_188.first);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_188.first._M_dataplus._M_p != paVar10) {
                  operator_delete(local_188.first._M_dataplus._M_p,
                                  local_188.first.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218._M_dataplus._M_p != paVar16) {
                  operator_delete(local_218._M_dataplus._M_p,
                                  local_218.field_2._M_allocated_capacity + 1);
                }
                pMVar2 = (local_198->
                         super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start[uVar11]._M_current;
                p_Var4 = *(_Bit_type **)
                          &(pMVar2->optional).super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data;
                if (((p_Var4 != (((_Bit_iterator *)
                                 ((long)&(pMVar2->optional).
                                         super__Bvector_base<std::allocator<bool>_>._M_impl + 0x10))
                                ->super__Bit_iterator_base)._M_p) ||
                    (*(uint *)((long)&(pMVar2->optional).super__Bvector_base<std::allocator<bool>_>.
                                      _M_impl + 0x18) != 0)) && ((*p_Var4 & 1) != 0)) {
                  local_218._M_dataplus._M_p = (pointer)paVar16;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_218,local_238._M_dataplus._M_p,
                             local_238._M_dataplus._M_p + local_238._M_string_length);
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append(&local_218,".empty() || ");
                  pbVar8 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                           _M_append(&local_218,local_1f8._M_dataplus._M_p,
                                     local_1f8._M_string_length);
                  local_188.first._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
                  paVar13 = &pbVar8->field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_188.first._M_dataplus._M_p == paVar13) {
                    local_188.first.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                    local_188.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
                    local_188.first._M_dataplus._M_p = (pointer)paVar10;
                  }
                  else {
                    local_188.first.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                  }
                  local_188.first._M_string_length = pbVar8->_M_string_length;
                  (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
                  pbVar8->_M_string_length = 0;
                  (pbVar8->field_2)._M_local_buf[0] = '\0';
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator=(&local_1f8,&local_188.first);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_188.first._M_dataplus._M_p != paVar10) {
                    operator_delete(local_188.first._M_dataplus._M_p,
                                    local_188.first.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_218._M_dataplus._M_p != paVar16) {
                    operator_delete(local_218._M_dataplus._M_p,
                                    local_218.field_2._M_allocated_capacity + 1);
                  }
                  std::operator+(&local_108,"!",&local_238);
                  pbVar8 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                     (&local_108,".empty() && ");
                  local_218._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
                  paVar13 = &pbVar8->field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_218._M_dataplus._M_p == paVar13) {
                    local_218.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                    local_218.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
                    local_218._M_dataplus._M_p = (pointer)paVar16;
                  }
                  else {
                    local_218.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                  }
                  local_218._M_string_length = pbVar8->_M_string_length;
                  (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
                  pbVar8->_M_string_length = 0;
                  (pbVar8->field_2)._M_local_buf[0] = '\0';
                  pbVar8 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                           _M_append(&local_218,local_1d8._M_dataplus._M_p,
                                     local_1d8._M_string_length);
                  local_188.first._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
                  paVar13 = &pbVar8->field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_188.first._M_dataplus._M_p == paVar13) {
                    local_188.first.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                    local_188.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
                    local_188.first._M_dataplus._M_p = (pointer)paVar10;
                  }
                  else {
                    local_188.first.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                  }
                  local_188.first._M_string_length = pbVar8->_M_string_length;
                  (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
                  pbVar8->_M_string_length = 0;
                  (pbVar8->field_2)._M_local_buf[0] = '\0';
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator=(&local_1d8,&local_188.first);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_188.first._M_dataplus._M_p != paVar10) {
                    operator_delete(local_188.first._M_dataplus._M_p,
                                    local_188.first.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_218._M_dataplus._M_p != paVar16) {
                    operator_delete(local_218._M_dataplus._M_p,
                                    local_218.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_108._M_dataplus._M_p != &local_108.field_2) {
                    operator_delete(local_108._M_dataplus._M_p,
                                    local_108.field_2._M_allocated_capacity + 1);
                  }
                }
                pMVar2 = (local_198->
                         super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start[local_b8]._M_current;
                p_Var4 = *(_Bit_type **)
                          &(pMVar2->optional).super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data;
                if (((p_Var4 != (((_Bit_iterator *)
                                 ((long)&(pMVar2->optional).
                                         super__Bvector_base<std::allocator<bool>_>._M_impl + 0x10))
                                ->super__Bit_iterator_base)._M_p) ||
                    (*(uint *)((long)&(pMVar2->optional).super__Bvector_base<std::allocator<bool>_>.
                                      _M_impl + 0x18) != 0)) && ((*p_Var4 & 1) != 0)) {
                  local_218._M_dataplus._M_p = (pointer)paVar16;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_218,local_1b8._M_dataplus._M_p,
                             local_1b8._M_dataplus._M_p + local_1b8._M_string_length);
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  append(&local_218,".empty() || ");
                  pbVar8 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                           _M_append(&local_218,local_1f8._M_dataplus._M_p,
                                     local_1f8._M_string_length);
                  local_188.first._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
                  paVar13 = &pbVar8->field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_188.first._M_dataplus._M_p == paVar13) {
                    local_188.first.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                    local_188.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
                    local_188.first._M_dataplus._M_p = (pointer)paVar10;
                  }
                  else {
                    local_188.first.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                  }
                  local_188.first._M_string_length = pbVar8->_M_string_length;
                  (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
                  pbVar8->_M_string_length = 0;
                  (pbVar8->field_2)._M_local_buf[0] = '\0';
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator=(&local_1f8,&local_188.first);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_188.first._M_dataplus._M_p != paVar10) {
                    operator_delete(local_188.first._M_dataplus._M_p,
                                    local_188.first.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_218._M_dataplus._M_p != paVar16) {
                    operator_delete(local_218._M_dataplus._M_p,
                                    local_218.field_2._M_allocated_capacity + 1);
                  }
                  std::operator+(&local_108,"!",&local_1b8);
                  pbVar8 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                     (&local_108,".empty() && ");
                  local_218._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
                  paVar13 = &pbVar8->field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_218._M_dataplus._M_p == paVar13) {
                    local_218.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                    local_218.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
                    local_218._M_dataplus._M_p = (pointer)paVar16;
                  }
                  else {
                    local_218.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                  }
                  local_218._M_string_length = pbVar8->_M_string_length;
                  (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
                  pbVar8->_M_string_length = 0;
                  (pbVar8->field_2)._M_local_buf[0] = '\0';
                  pbVar8 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                           _M_append(&local_218,local_1d8._M_dataplus._M_p,
                                     local_1d8._M_string_length);
                  local_188.first._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
                  paVar13 = &pbVar8->field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_188.first._M_dataplus._M_p == paVar13) {
                    local_188.first.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                    local_188.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
                    local_188.first._M_dataplus._M_p = (pointer)paVar10;
                  }
                  else {
                    local_188.first.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                  }
                  local_188.first._M_string_length = pbVar8->_M_string_length;
                  (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
                  pbVar8->_M_string_length = 0;
                  (pbVar8->field_2)._M_local_buf[0] = '\0';
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  operator=(&local_1d8,&local_188.first);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_188.first._M_dataplus._M_p != paVar10) {
                    operator_delete(local_188.first._M_dataplus._M_p,
                                    local_188.first.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_218._M_dataplus._M_p != paVar16) {
                    operator_delete(local_218._M_dataplus._M_p,
                                    local_218.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_108._M_dataplus._M_p != &local_108.field_2) {
                    operator_delete(local_108._M_dataplus._M_p,
                                    local_108.field_2._M_allocated_capacity + 1);
                  }
                }
              }
              std::operator+(&local_218,"      VULKAN_HPP_ASSERT( ",&local_1f8);
              pbVar8 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                 (&local_218," );\n");
              local_188.first._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
              paVar13 = &pbVar8->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188.first._M_dataplus._M_p == paVar13) {
                local_188.first.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                local_188.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
                local_188.first._M_dataplus._M_p = (pointer)paVar10;
              }
              else {
                local_188.first.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
              }
              local_188.first._M_string_length = pbVar8->_M_string_length;
              (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
              pbVar8->_M_string_length = 0;
              (pbVar8->field_2)._M_local_buf[0] = '\0';
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_b0,local_188.first._M_dataplus._M_p,local_188.first._M_string_length)
              ;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188.first._M_dataplus._M_p != paVar10) {
                operator_delete(local_188.first._M_dataplus._M_p,
                                local_188.first.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218._M_dataplus._M_p != paVar16) {
                operator_delete(local_218._M_dataplus._M_p,
                                local_218.field_2._M_allocated_capacity + 1);
              }
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<const_char_(&)[11],_true>(&local_188,(char (*) [11])"structName",local_c0);
              std::
              pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::
              pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                        (&local_148,(char (*) [11])"throwCheck",&local_1d8);
              __l._M_len = 2;
              __l._M_array = &local_188;
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&local_60,__l,
                    (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_108,&local_189);
              replaceWithMap(&local_218,
                             &generateSizeCheck(std::vector<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>,std::allocator<__gnu_cxx::__normal_iterator<VulkanHppGenerator::MemberData_const*,std::vector<VulkanHppGenerator::MemberData,std::allocator<VulkanHppGenerator::MemberData>>>>>const&,std::__cxx11::string_const&,bool)
                              ::throwTextTemplate_abi_cxx11_,
                             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&local_60);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(&local_e8,local_218._M_dataplus._M_p,local_218._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218._M_dataplus._M_p != paVar16) {
                operator_delete(local_218._M_dataplus._M_p,
                                local_218.field_2._M_allocated_capacity + 1);
              }
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~_Rb_tree(&local_60);
              lVar15 = -0x80;
              paVar13 = &local_148.second.field_2;
              do {
                if (paVar13 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar13->_M_allocated_capacity)[-2]) {
                  operator_delete((long *)(&paVar13->_M_allocated_capacity)[-2],
                                  paVar13->_M_allocated_capacity + 1);
                }
                if (&paVar13->_M_allocated_capacity + -4 !=
                    (size_type *)(&paVar13->_M_allocated_capacity)[-6]) {
                  operator_delete((size_type *)(&paVar13->_M_allocated_capacity)[-6],
                                  (&paVar13->_M_allocated_capacity)[-4] + 1);
                }
                paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(&paVar13->_M_allocated_capacity + -8);
                lVar15 = lVar15 + 0x40;
              } while (lVar15 != 0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                operator_delete(local_1d8._M_dataplus._M_p,
                                local_1d8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                operator_delete(local_1f8._M_dataplus._M_p,
                                local_1f8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_238._M_dataplus._M_p != &local_238.field_2) {
                operator_delete(local_238._M_dataplus._M_p,
                                local_238.field_2._M_allocated_capacity + 1);
              }
              uVar11 = uVar11 + 1;
              p_Var9 = (local_198->
                       super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
            } while (uVar11 < (ulong)((long)(local_198->
                                            super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                      (long)p_Var9 >> 3));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
            operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
          }
          uVar11 = local_c8 + 1;
          p_Var9 = (local_198->
                   super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          uVar14 = local_c8;
        } while (uVar11 < (ulong)((long)(local_198->
                                        super__Vector_base<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_VulkanHppGenerator::MemberData_*,_std::vector<VulkanHppGenerator::MemberData,_std::allocator<VulkanHppGenerator::MemberData>_>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)p_Var9
                                 >> 3));
      }
    }
    std::operator+(&local_1d8,"\n#ifdef VULKAN_HPP_NO_EXCEPTIONS\n",&local_b0);
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_1d8,"#else\n");
    local_1f8._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar16 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p == paVar16) {
      local_1f8.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
      local_1f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    }
    else {
      local_1f8.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
    }
    local_1f8._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar16;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_1f8,local_e8._M_dataplus._M_p,local_e8._M_string_length);
    local_238._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar16 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p == paVar16) {
      local_238.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
      local_238.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    }
    else {
      local_238.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
    }
    local_238._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar16;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_238,"#endif /*VULKAN_HPP_NO_EXCEPTIONS*/\n");
    local_1b8._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar16 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p == paVar16) {
      local_1b8.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
      local_1b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    }
    else {
      local_1b8.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
    }
    local_1b8._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar16;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_1b8,"    ");
    paVar16 = &local_188.first.field_2;
    local_188.first._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar10 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188.first._M_dataplus._M_p == paVar10) {
      local_188.first.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_188.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_188.first._M_dataplus._M_p = (pointer)paVar16;
    }
    else {
      local_188.first.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    }
    local_188.first._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (__return_storage_ptr__,local_188.first._M_dataplus._M_p,
               local_188.first._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188.first._M_dataplus._M_p != paVar16) {
      operator_delete(local_188.first._M_dataplus._M_p,
                      local_188.first.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,
                      CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                               local_e8.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,
                      CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                               local_b0.field_2._M_local_buf[0]) + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateSizeCheck( std::vector<std::vector<MemberData>::const_iterator> const & arrayIts,
                                                   std::string const &                                          structName,
                                                   bool                                                         mutualExclusiveLens ) const
{
  std::string sizeCheck;
  if ( 1 < arrayIts.size() )
  {
    static const std::string throwTextTemplate = R"(      if ( ${throwCheck} )
      {
        throw LogicError( VULKAN_HPP_NAMESPACE_STRING"::${structName}::${structName}: ${throwCheck}" );
      }
)";

    std::string assertionText, throwText;
    if ( mutualExclusiveLens )
    {
      // exactly one of the arrays has to be non-empty
      std::string sum;
      for ( auto it : arrayIts )
      {
        sum += "!" + startLowerCase( stripPrefix( it->name, "p" ) ) + "_.empty() + ";
      }
      sum.resize( sum.size() - 3 );
      assertionText += "      VULKAN_HPP_ASSERT( ( " + sum + " ) <= 1);\n";
      throwText += replaceWithMap( throwTextTemplate, { { "structName", structName }, { "throwCheck", "1 < ( " + sum + " )" } } );
    }
    else
    {
      for ( size_t first = 0; first + 1 < arrayIts.size(); ++first )
      {
        assert( arrayIts[first]->name.starts_with( "p" ) );
        std::string firstName = startLowerCase( stripPrefix( arrayIts[first]->name, "p" ) ) + "_";
        for ( auto second = first + 1; second < arrayIts.size(); ++second )
        {
          assert( arrayIts[second]->name.starts_with( "p" ) );
          std::string secondName     = startLowerCase( stripPrefix( arrayIts[second]->name, "p" ) ) + "_";
          std::string assertionCheck = firstName + ".size() == " + secondName + ".size()";
          std::string throwCheck     = firstName + ".size() != " + secondName + ".size()";
          if ( ( !arrayIts[first]->optional.empty() && arrayIts[first]->optional.front() ) ||
               ( !arrayIts[second]->optional.empty() && arrayIts[second]->optional.front() ) )
          {
            assertionCheck = "( " + assertionCheck + " )";
            throwCheck     = "( " + throwCheck + " )";
            if ( !arrayIts[second]->optional.empty() && arrayIts[second]->optional.front() )
            {
              assertionCheck = secondName + ".empty() || " + assertionCheck;
              throwCheck     = "!" + secondName + ".empty() && " + throwCheck;
            }
            if ( !arrayIts[first]->optional.empty() && arrayIts[first]->optional.front() )
            {
              assertionCheck = firstName + ".empty() || " + assertionCheck;
              throwCheck     = "!" + firstName + ".empty() && " + throwCheck;
            }
          }
          assertionText += "      VULKAN_HPP_ASSERT( " + assertionCheck + " );\n";
          throwText += replaceWithMap( throwTextTemplate, { { "structName", structName }, { "throwCheck", throwCheck } } );
        }
      }
    }
    sizeCheck += "\n#ifdef VULKAN_HPP_NO_EXCEPTIONS\n" + assertionText + "#else\n" + throwText + "#endif /*VULKAN_HPP_NO_EXCEPTIONS*/\n" + "    ";
  }
  return sizeCheck;
}